

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maths.c
# Opt level: O2

_Bool intersect_segment_triangle(vec3 p,vec3 q,vec3 a,vec3 b,vec3 c,float *t)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  vec3 vVar10;
  vec3 v1;
  vec3 v2;
  vec3 v2_00;
  
  fVar2 = a.z;
  fVar1 = a.x;
  fVar3 = a.y;
  fVar5 = b.x - fVar1;
  fVar6 = b.y - fVar3;
  fVar7 = b.z - fVar2;
  fVar8 = c.x - fVar1;
  fVar9 = c.y - fVar3;
  v1.x = p.x - q.x;
  v1.y = p.y - q.y;
  v1.z = p.z - q.z;
  v2.y = fVar9;
  v2.x = fVar8;
  vVar10.y = fVar6;
  vVar10.x = fVar5;
  vVar10.z = fVar7;
  v2.z = c.z - fVar2;
  vVar10 = vec3_cross(vVar10,v2);
  fVar4 = v1.z * vVar10.z + v1.x * vVar10.x + v1.y * vVar10.y;
  if (0.0 < fVar4) {
    v2_00.x = p.x - fVar1;
    v2_00.y = p.y - fVar3;
    v2_00.z = p.z - fVar2;
    fVar1 = vVar10.z * v2_00.z + v2_00.x * vVar10.x + vVar10.y * v2_00.y;
    *t = fVar1;
    if (0.0 <= fVar1) {
      vVar10 = vec3_cross(v1,v2_00);
      fVar3 = (c.z - fVar2) * vVar10.z + fVar8 * vVar10.x + fVar9 * vVar10.y;
      if (fVar3 < 0.0) {
        return false;
      }
      if (fVar4 < fVar3) {
        return false;
      }
      fVar2 = fVar7 * vVar10.z + vVar10.x * fVar5 + vVar10.y * fVar6;
      if (0.0 < fVar2) {
        return false;
      }
      if (fVar4 < fVar3 - fVar2) {
        return false;
      }
      *t = fVar1 * (1.0 / fVar4);
      return true;
    }
  }
  return false;
}

Assistant:

static bool intersect_segment_triangle(vec3 p, vec3 q, vec3 a, vec3 b, vec3 c, float *t) {
    vec3 ab = vec3_subtract(b, a);
    vec3 ac = vec3_subtract(c, a);
    vec3 qp = vec3_subtract(p, q);

    vec3 n = vec3_cross(ab, ac);

    float d = vec3_dot(qp, n);
    if (d <= 0.0f) return false;

    vec3 ap = vec3_subtract(p, a);
    *t = vec3_dot(ap, n);
    if (*t < 0.0f) return false;
    //if (*t > d) return false;

    vec3 e = vec3_cross(qp, ap);
    float v = vec3_dot(ac, e);
    if (v < 0.0f || v > d) return false;
    float w = -vec3_dot(ab, e);
    if (w < 0.0f || v + w > d) return false;

    float ood = 1.0f / d;
    *t *= ood;
    return true;
}